

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomFourAction::Throw(BlueRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  itemType local_34;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == ROPE) {
    local_34 = ROPE;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 != HIDDEN) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_30,
                 "You comically try and toss the rope as far as you can. Being attached to the floor, it doesn\'t work well."
                 ,(allocator *)&local_34);
      ActionResults::ActionResults(pAVar3,CURRENT,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return pAVar3;
    }
  }
  pAVar3 = AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  return pAVar3;
}

Assistant:

ActionResults * BlueRoomFourAction::Throw() {
    if(commands->getMainItem() == ROPE && itemList->getValue(ROPE)->getLocation() != HIDDEN){
        return new ActionResults(CURRENT, "You comically try and toss the rope as far as you can. Being attached to the floor, it doesn't work well.");
    } else {
        return AbstractRoomAction::Throw();
    }
}